

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,integer_type i,
          integer_format_info *fmt,source_location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint *puVar4;
  integer_format iVar5;
  long lVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined8 *puVar9;
  uint uVar10;
  integer_format c;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  pointer pcVar14;
  bool bVar15;
  string tmp;
  anon_class_8_1_ba1d47ed insert_spacer;
  string retval;
  ostringstream oss;
  string local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  string local_538;
  anon_class_8_1_ba1d47ed local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  char *local_4f0;
  size_type local_4e8;
  char local_4e0;
  undefined7 uStack_4df;
  undefined8 local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string local_4b0;
  string local_490;
  locale local_470 [8];
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  source_location local_388;
  source_location local_310;
  long local_298 [2];
  long lStack_288;
  uint auStack_280 [22];
  ios_base local_228 [112];
  char acStack_1b8 [152];
  source_location local_120;
  source_location local_a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
  std::locale::classic();
  std::ios::imbue(local_470);
  std::locale::~locale(local_470);
  paVar2 = &local_510.field_2;
  local_510._M_string_length = 0;
  local_510.field_2._M_local_buf[0] = '\0';
  iVar5 = fmt->fmt;
  local_518.fmt = fmt;
  local_510._M_dataplus._M_p = (pointer)paVar2;
  if (iVar5 == dec) {
    *(long *)((long)&lStack_288 + *(long *)(local_298[0] + -0x18)) = (long)(int)fmt->width;
    *(uint *)((long)auStack_280 + *(long *)(local_298[0] + -0x18)) =
         *(uint *)((long)auStack_280 + *(long *)(local_298[0] + -0x18)) & 0xffffffb5 | 2;
    std::ostream::_M_insert<long>((long)local_298);
    std::__cxx11::stringbuf::str();
    operator()::anon_class_8_1_ba1d47ed::operator()(&local_578,&local_518,&local_408);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_510,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_510,'_');
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(&local_510,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
    }
    goto LAB_00395eeb;
  }
  if (i < 0) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0xa0);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_468,
               "binary, octal, hexadecimal integer does not allow negative value","");
    source_location::source_location(&local_a8,loc);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"here","");
    format_error<>(&local_490,&local_468,&local_a8,&local_3c8);
    source_location::source_location(&local_310,loc);
    *puVar9 = &PTR__serialization_error_004e0968;
    puVar9[1] = puVar9 + 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p == &local_490.field_2) {
      puVar9[3] = CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                           local_490.field_2._M_local_buf[0]);
      puVar9[4] = local_490.field_2._8_8_;
    }
    else {
      puVar9[1] = local_490._M_dataplus._M_p;
      puVar9[3] = CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                           local_490.field_2._M_local_buf[0]);
    }
    puVar9[2] = local_490._M_string_length;
    local_490._M_string_length = 0;
    local_490.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_310.file_name_.field_2;
    *(undefined4 *)(puVar9 + 0xb) = (undefined4)local_310.last_offset_;
    *(undefined4 *)((long)puVar9 + 0x5c) = local_310.last_offset_._4_4_;
    *(undefined4 *)(puVar9 + 0xc) = (undefined4)local_310.length_;
    *(undefined4 *)((long)puVar9 + 100) = local_310.length_._4_4_;
    *(undefined4 *)(puVar9 + 9) = (undefined4)local_310.last_line_;
    *(undefined4 *)((long)puVar9 + 0x4c) = local_310.last_line_._4_4_;
    *(undefined4 *)(puVar9 + 10) = (undefined4)local_310.last_column_;
    *(undefined4 *)((long)puVar9 + 0x54) = local_310.last_column_._4_4_;
    *(undefined4 *)(puVar9 + 7) = (undefined4)local_310.first_column_;
    *(undefined4 *)((long)puVar9 + 0x3c) = local_310.first_column_._4_4_;
    *(undefined4 *)(puVar9 + 8) = (undefined4)local_310.first_offset_;
    *(undefined4 *)((long)puVar9 + 0x44) = local_310.first_offset_._4_4_;
    puVar9[5] = local_310._0_8_;
    puVar9[6] = local_310.first_line_;
    puVar9[0xd] = puVar9 + 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.file_name_._M_dataplus._M_p == paVar3) {
      puVar9[0xf] = CONCAT71(local_310.file_name_.field_2._M_allocated_capacity._1_7_,
                             local_310.file_name_.field_2._M_local_buf[0]);
      puVar9[0x10] = local_310.file_name_.field_2._8_8_;
    }
    else {
      puVar9[0xd] = local_310.file_name_._M_dataplus._M_p;
      puVar9[0xf] = CONCAT71(local_310.file_name_.field_2._M_allocated_capacity._1_7_,
                             local_310.file_name_.field_2._M_local_buf[0]);
    }
    puVar9[0xe] = local_310.file_name_._M_string_length;
    local_310.file_name_._M_string_length = 0;
    local_310.file_name_.field_2._M_local_buf[0] = '\0';
    puVar9[0x11] = local_310.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    puVar9[0x12] = local_310.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    puVar9[0x13] = local_310.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_310.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_310.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_310.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    local_310.file_name_._M_dataplus._M_p = (pointer)paVar3;
    __cxa_throw(puVar9,&serialization_error::typeinfo,serialization_error::~serialization_error);
  }
  if (iVar5 == bin) {
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    local_578._M_string_length = 0;
    local_578.field_2._M_allocated_capacity =
         local_578.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar13 = 0;
    if (i != 0) {
      do {
        if ((uVar13 != 0 && fmt->spacer != 0) && (uVar13 % fmt->spacer == 0)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_578,
                    '_');
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_578,
                  (byte)i & 1 | 0x30);
        uVar13 = uVar13 + 1;
        bVar15 = 1 < (ulong)i;
        i = (ulong)i >> 1;
      } while (bVar15);
    }
    if (uVar13 < fmt->width) {
      do {
        if ((uVar13 != 0 && fmt->spacer != 0) && (uVar13 % fmt->spacer == 0)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_578,
                    '_');
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_578,
                  '0');
        uVar13 = uVar13 + 1;
      } while (uVar13 < fmt->width);
    }
    if (local_578._M_string_length != 0) {
      pcVar14 = local_578._M_dataplus._M_p + local_578._M_string_length;
      do {
        local_558._M_dataplus._M_p._0_1_ = pcVar14[-1];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,(char *)&local_558,1);
        pcVar14 = pcVar14 + -1;
      } while (pcVar14 != local_578._M_dataplus._M_p);
    }
    paVar3 = &local_538.field_2;
    local_538._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"0b","");
    std::__cxx11::stringbuf::str();
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != paVar3) {
      uVar11 = local_538.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_4d0._M_string_length + local_538._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        uVar11 = local_4d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_4d0._M_string_length + local_538._M_string_length)
      goto LAB_00395bb0;
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_4d0,0,0,local_538._M_dataplus._M_p,local_538._M_string_length);
    }
    else {
LAB_00395bb0:
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_538,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
    }
    local_558._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar1 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p == paVar1) {
      local_558.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_558.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    }
    else {
      local_558.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_558._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar8->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_510,&local_558);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != paVar3) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    uVar11 = local_578.field_2._M_allocated_capacity;
    _Var12._M_p = local_578._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p == &local_578.field_2) goto LAB_00395eeb;
  }
  else {
    if (iVar5 == oct) {
      *(long *)((long)&lStack_288 + *(long *)(local_298[0] + -0x18)) = (long)(int)fmt->width;
      lVar6 = *(long *)(local_298[0] + -0x18);
      if (acStack_1b8[lVar6 + 1] == '\0') {
        std::ios::widen((char)&local_578 + (char)lVar6 + -0x20);
        acStack_1b8[lVar6 + 1] = '\x01';
      }
      acStack_1b8[lVar6] = '0';
      *(uint *)((long)auStack_280 + *(long *)(local_298[0] + -0x18)) =
           *(uint *)((long)auStack_280 + *(long *)(local_298[0] + -0x18)) & 0xffffffb5 | 0x40;
      std::ostream::_M_insert<long>((long)local_298);
      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"0o","");
      std::__cxx11::stringbuf::str();
      operator()::anon_class_8_1_ba1d47ed::operator()(&local_538,&local_518,&local_448);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        uVar11 = local_558.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_538._M_string_length + local_558._M_string_length) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          uVar11 = local_538.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_538._M_string_length + local_558._M_string_length)
        goto LAB_00395a19;
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_538,0,0,local_558._M_dataplus._M_p,local_558._M_string_length);
      }
      else {
LAB_00395a19:
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_558,local_538._M_dataplus._M_p,local_538._M_string_length);
      }
      local_578._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar1 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p == paVar1) {
        local_578.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_578.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      }
      else {
        local_578.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_578._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar8->_M_string_length = 0;
      paVar1->_M_local_buf[0] = '\0';
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&local_510,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_578);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) goto LAB_00395df4;
    }
    else {
      if (iVar5 != hex) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0xa0);
        to_string_abi_cxx11_(&local_578,(toml *)(ulong)fmt->fmt,c);
        std::operator+(&local_3a8,"none of dec, hex, oct, bin: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_578);
        source_location::source_location(&local_120,loc);
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"here","");
        format_error<>(&local_4b0,(string *)&local_3a8,&local_120,&local_3e8);
        source_location::source_location(&local_388,loc);
        *puVar9 = &PTR__serialization_error_004e0968;
        puVar9[1] = puVar9 + 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p == &local_4b0.field_2) {
          puVar9[3] = CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                               local_4b0.field_2._M_local_buf[0]);
          puVar9[4] = local_4b0.field_2._8_8_;
        }
        else {
          puVar9[1] = local_4b0._M_dataplus._M_p;
          puVar9[3] = CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                               local_4b0.field_2._M_local_buf[0]);
        }
        puVar9[2] = local_4b0._M_string_length;
        local_4b0._M_string_length = 0;
        local_4b0.field_2._M_local_buf[0] = '\0';
        paVar3 = &local_388.file_name_.field_2;
        *(undefined4 *)(puVar9 + 0xb) = (undefined4)local_388.last_offset_;
        *(undefined4 *)((long)puVar9 + 0x5c) = local_388.last_offset_._4_4_;
        *(undefined4 *)(puVar9 + 0xc) = (undefined4)local_388.length_;
        *(undefined4 *)((long)puVar9 + 100) = local_388.length_._4_4_;
        *(undefined4 *)(puVar9 + 9) = (undefined4)local_388.last_line_;
        *(undefined4 *)((long)puVar9 + 0x4c) = local_388.last_line_._4_4_;
        *(undefined4 *)(puVar9 + 10) = (undefined4)local_388.last_column_;
        *(undefined4 *)((long)puVar9 + 0x54) = local_388.last_column_._4_4_;
        *(undefined4 *)(puVar9 + 7) = (undefined4)local_388.first_column_;
        *(undefined4 *)((long)puVar9 + 0x3c) = local_388.first_column_._4_4_;
        *(undefined4 *)(puVar9 + 8) = (undefined4)local_388.first_offset_;
        *(undefined4 *)((long)puVar9 + 0x44) = local_388.first_offset_._4_4_;
        puVar9[5] = local_388._0_8_;
        puVar9[6] = local_388.first_line_;
        puVar9[0xd] = puVar9 + 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388.file_name_._M_dataplus._M_p == paVar3) {
          puVar9[0xf] = CONCAT71(local_388.file_name_.field_2._M_allocated_capacity._1_7_,
                                 local_388.file_name_.field_2._M_local_buf[0]);
          puVar9[0x10] = local_388.file_name_.field_2._8_8_;
        }
        else {
          puVar9[0xd] = local_388.file_name_._M_dataplus._M_p;
          puVar9[0xf] = CONCAT71(local_388.file_name_.field_2._M_allocated_capacity._1_7_,
                                 local_388.file_name_.field_2._M_local_buf[0]);
        }
        puVar9[0xe] = local_388.file_name_._M_string_length;
        local_388.file_name_._M_string_length = 0;
        local_388.file_name_.field_2._M_local_buf[0] = '\0';
        puVar9[0x11] = local_388.line_str_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        puVar9[0x12] = local_388.line_str_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        puVar9[0x13] = local_388.line_str_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_388.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_388.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_388.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        local_388.file_name_._M_dataplus._M_p = (pointer)paVar3;
        __cxa_throw(puVar9,&serialization_error::typeinfo,serialization_error::~serialization_error)
        ;
      }
      puVar4 = (uint *)((long)auStack_280 + *(long *)(local_298[0] + -0x18));
      *puVar4 = *puVar4 & 0xfffffdff;
      *(long *)((long)&lStack_288 + *(long *)(local_298[0] + -0x18)) = (long)(int)fmt->width;
      lVar6 = *(long *)(local_298[0] + -0x18);
      if (acStack_1b8[lVar6 + 1] == '\0') {
        std::ios::widen((char)&local_578 + (char)lVar6 + -0x20);
        acStack_1b8[lVar6 + 1] = '\x01';
      }
      acStack_1b8[lVar6] = '0';
      *(uint *)((long)auStack_280 + *(long *)(local_298[0] + -0x18)) =
           *(uint *)((long)auStack_280 + *(long *)(local_298[0] + -0x18)) & 0xffffffb5 | 8;
      lVar6 = *(long *)(local_298[0] + -0x18);
      if (fmt->uppercase == true) {
        uVar10 = *(uint *)((long)auStack_280 + lVar6) | 0x4000;
      }
      else {
        uVar10 = *(uint *)((long)auStack_280 + lVar6) & 0xffffbfff;
      }
      *(uint *)((long)auStack_280 + lVar6) = uVar10;
      std::ostream::_M_insert<long>((long)local_298);
      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"0x","");
      std::__cxx11::stringbuf::str();
      operator()::anon_class_8_1_ba1d47ed::operator()(&local_538,&local_518,&local_428);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        uVar11 = local_558.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_538._M_string_length + local_558._M_string_length) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          uVar11 = local_538.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_538._M_string_length + local_558._M_string_length)
        goto LAB_00395c78;
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_538,0,0,local_558._M_dataplus._M_p,local_558._M_string_length);
      }
      else {
LAB_00395c78:
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_558,local_538._M_dataplus._M_p,local_538._M_string_length);
      }
      local_578._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar1 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p == paVar1) {
        local_578.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_578.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      }
      else {
        local_578.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_578._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar8->_M_string_length = 0;
      paVar1->_M_local_buf[0] = '\0';
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&local_510,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_578);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
      }
      local_448.field_2._M_allocated_capacity = local_428.field_2._M_allocated_capacity;
      local_448._M_dataplus._M_p = local_428._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
LAB_00395df4:
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
    }
    uVar11 = local_558.field_2._M_allocated_capacity;
    _Var12._M_p = local_558._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p == &local_558.field_2) goto LAB_00395eeb;
  }
  operator_delete(_Var12._M_p,uVar11 + 1);
LAB_00395eeb:
  local_4f0 = &local_4e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f0,local_510._M_dataplus._M_p,
             local_510._M_dataplus._M_p + local_510._M_string_length);
  sVar7 = local_4e8;
  if (local_4f0 == &local_4e0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4df,local_4e0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_4d8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_4f0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4df,local_4e0);
    local_4f0 = &local_4e0;
  }
  local_4e0 = '\0';
  local_4e8 = 0;
  __return_storage_ptr__->_M_string_length = sVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != paVar2) {
    operator_delete(local_510._M_dataplus._M_p,
                    CONCAT71(local_510.field_2._M_allocated_capacity._1_7_,
                             local_510.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
  std::ios_base::~ios_base(local_228);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const integer_type i, const integer_format_info& fmt, const source_location& loc) // {{{
    {
        std::ostringstream oss;
        this->set_locale(oss);

        const auto insert_spacer = [&fmt](std::string s) -> std::string {
            if(fmt.spacer == 0) {return s;}

            std::string sign;
            if( ! s.empty() && (s.at(0) == '+' || s.at(0) == '-'))
            {
                sign += s.at(0);
                s.erase(s.begin());
            }

            std::string spaced;
            std::size_t counter = 0;
            for(auto iter = s.rbegin(); iter != s.rend(); ++iter)
            {
                if(counter != 0 && counter % fmt.spacer == 0)
                {
                    spaced += '_';
                }
                spaced += *iter;
                counter += 1;
            }
            if(!spaced.empty() && spaced.back() == '_') {spaced.pop_back();}

            s.clear();
            std::copy(spaced.rbegin(), spaced.rend(), std::back_inserter(s));
            return sign + s;
        };

        std::string retval;
        if(fmt.fmt == integer_format::dec)
        {
            oss << std::setw(static_cast<int>(fmt.width)) << std::dec << i;
            retval = insert_spacer(oss.str());

            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                retval += '_';
                retval += fmt.suffix;
            }
        }
        else
        {
            if(i < 0)
            {
                throw serialization_error(format_error("binary, octal, hexadecimal "
                    "integer does not allow negative value", loc, "here"), loc);
            }
            switch(fmt.fmt)
            {
                case integer_format::hex:
                {
                    oss << std::noshowbase
                        << std::setw(static_cast<int>(fmt.width))
                        << std::setfill('0')
                        << std::hex;
                    if(fmt.uppercase)
                    {
                        oss << std::uppercase;
                    }
                    else
                    {
                        oss << std::nouppercase;
                    }
                    oss << i;
                    retval = std::string("0x") + insert_spacer(oss.str());
                    break;
                }
                case integer_format::oct:
                {
                    oss << std::setw(static_cast<int>(fmt.width)) << std::setfill('0') << std::oct << i;
                    retval = std::string("0o") + insert_spacer(oss.str());
                    break;
                }
                case integer_format::bin:
                {
                    integer_type x{i};
                    std::string tmp;
                    std::size_t bits(0);
                    while(x != 0)
                    {
                        if(fmt.spacer != 0)
                        {
                            if(bits != 0 && (bits % fmt.spacer) == 0) {tmp += '_';}
                        }
                        if(x % 2 == 1) { tmp += '1'; } else { tmp += '0'; }
                        x >>= 1;
                        bits += 1;
                    }
                    for(; bits < fmt.width; ++bits)
                    {
                        if(fmt.spacer != 0)
                        {
                            if(bits != 0 && (bits % fmt.spacer) == 0) {tmp += '_';}
                        }
                        tmp += '0';
                    }
                    for(auto iter = tmp.rbegin(); iter != tmp.rend(); ++iter)
                    {
                        oss << *iter;
                    }
                    retval = std::string("0b") + oss.str();
                    break;
                }
                default:
                {
                    throw serialization_error(format_error(
                        "none of dec, hex, oct, bin: " + to_string(fmt.fmt),
                        loc, "here"), loc);
                }
            }
        }
        return string_conv<string_type>(retval);
    }